

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volid_test.cpp
# Opt level: O2

void __thiscall default_volid_lic_file::test_method(default_volid_lic_file *this)

{
  LicenseLocation licenseLocation;
  unit_test_log_t *puVar1;
  FUNCTION_RETURN FVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  uint local_bd0;
  EVENT_TYPE result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraArgs;
  uint7 uStack_b9f;
  char *local_b98;
  char *local_b90;
  undefined **local_b88;
  undefined1 local_b80;
  undefined1 *local_b78;
  char *local_b70;
  string licLocation;
  PcSignature identifier_out;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  char *local_ad8;
  char *local_ad0;
  char *local_ac8;
  char *local_ac0;
  undefined1 *local_ab8;
  undefined1 *local_ab0;
  char *local_aa8;
  char *local_aa0;
  pointer local_a98;
  pointer local_a90;
  LicenseInfo license;
  
  std::__cxx11::string::string
            ((string *)&licLocation,"Testing/Temporary/volid_license.lic",(allocator *)&license);
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b98 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
  ;
  local_b90 = "";
  memset(&license,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  std::operator<<((ostream *)&license,"Before generate");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_
                     ((basic_wrap_stringstream<char> *)&license);
  local_a98 = (pbVar3->_M_dataplus)._M_p;
  local_a90 = local_a98 + pbVar3->_M_string_length;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_b98,0x19);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&license);
  FVar2 = generate_user_pc_signature(identifier_out,ETHERNET);
  if (FVar2 == FUNC_RET_OK) {
    poVar4 = std::operator<<((ostream *)std::cout,"Identifier:");
    poVar4 = std::operator<<(poVar4,identifier_out);
    std::endl<char,std::char_traits<char>>(poVar4);
    extraArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extraArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    extraArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&license,"-s",(allocator *)&local_b88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extraArgs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&license);
    std::__cxx11::string::~string((string *)&license);
    std::__cxx11::string::string((string *)&license,identifier_out,(allocator *)&local_b88);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extraArgs,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&license);
    std::__cxx11::string::~string((string *)&license);
    generate_license(&licLocation,&extraArgs);
    licenseLocation.environmentVariableName = "";
    licenseLocation.licenseFileLocation = licLocation._M_dataplus._M_p;
    licenseLocation._16_8_ = (ulong)uStack_b9f << 8;
    result = acquire_license("TEST",licenseLocation,&license);
    local_aa8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_aa0 = "";
    local_ab8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_aa8,0x29);
    local_b80 = 0;
    local_b88 = &PTR__lazy_ostream_00633598;
    local_b78 = boost::unit_test::lazy_ostream::inst;
    local_b70 = "";
    local_ac8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_ac0 = "";
    local_bd0 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,EVENT_TYPE,EVENT_TYPE>
              (&local_b88,&local_ac8,0x29,1,2,&result,"result",&local_bd0,"LICENSE_OK");
    local_ad8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_ad0 = "";
    local_ae8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_ae0 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_ad8,0x2a);
    local_b80 = 0;
    local_b88 = &PTR__lazy_ostream_00633598;
    local_b78 = boost::unit_test::lazy_ostream::inst;
    local_b70 = "";
    local_af8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_af0 = "";
    local_bd0 = local_bd0 & 0xffffff00;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_b88,&local_af8,0x2a,1,2,&license.has_expiry,"license.has_expiry",&local_bd0,
               "false");
    local_b08 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_b00 = "";
    local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b08,0x2b);
    local_b80 = 0;
    local_b88 = &PTR__lazy_ostream_00633598;
    local_b78 = boost::unit_test::lazy_ostream::inst;
    local_b70 = "";
    local_b28 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
    ;
    local_b20 = "";
    local_bd0 = CONCAT31(local_bd0._1_3_,1);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_b88,&local_b28,0x2b,1,2,&license.linked_to_pc,"license.linked_to_pc",
               &local_bd0,"true");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extraArgs);
    std::__cxx11::string::~string((string *)&licLocation);
    return;
  }
  __assert_fail("generate_ok == FUNCTION_RETURN::FUNC_RET_OK",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/volid_test.cpp"
                ,0x1c,"void default_volid_lic_file::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE( default_volid_lic_file ) {
	const string licLocation(PROJECT_TEST_TEMP_DIR "/volid_license.lic");
	PcSignature identifier_out;

	IDENTIFICATION_STRATEGY strategy = IDENTIFICATION_STRATEGY::ETHERNET;
	BOOST_TEST_CHECKPOINT("Before generate");
	FUNCTION_RETURN generate_ok = generate_user_pc_signature(identifier_out,
			strategy);
	BOOST_ASSERT(generate_ok == FUNCTION_RETURN::FUNC_RET_OK);
	cout << "Identifier:" << identifier_out << endl;
	vector<string> extraArgs;
    extraArgs.push_back("-s");
    extraArgs.push_back(identifier_out);
	generate_license(licLocation, extraArgs);

	LicenseInfo license;
	LicenseLocation licenseLocation;
	licenseLocation.openFileNearModule = false;
	licenseLocation.licenseFileLocation = licLocation.c_str();
	licenseLocation.environmentVariableName = "";
	EVENT_TYPE result = acquire_license("TEST", licenseLocation, &license);
	BOOST_CHECK_EQUAL(result, LICENSE_OK);
	BOOST_CHECK_EQUAL(license.has_expiry, false);
	BOOST_CHECK_EQUAL(license.linked_to_pc, true);
}